

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

int __thiscall
SocketInternals::Recv(SocketInternals *this,uchar *bufrecv,size_t maxlen,double timeoutSec)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  ostream *poVar4;
  long *plVar5;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  iovec vec;
  timeval timeout;
  MsgHeaderType hdr;
  fd_set readfds;
  sockaddr_storage addrRemote;
  char controldata [1000];
  iovec local_570;
  timeval local_560;
  MsgHeaderType local_550;
  fd_set local_518;
  undefined1 local_498 [128];
  undefined1 local_418 [1008];
  
  local_518.fds_bits[0xe] = 0;
  local_518.fds_bits[0xf] = 0;
  local_518.fds_bits[0xc] = 0;
  local_518.fds_bits[0xd] = 0;
  local_518.fds_bits[10] = 0;
  local_518.fds_bits[0xb] = 0;
  local_518.fds_bits[8] = 0;
  local_518.fds_bits[9] = 0;
  local_518.fds_bits[6] = 0;
  local_518.fds_bits[7] = 0;
  local_518.fds_bits[4] = 0;
  local_518.fds_bits[5] = 0;
  local_518.fds_bits[2] = 0;
  local_518.fds_bits[3] = 0;
  local_518.fds_bits[0] = 0;
  local_518.fds_bits[1] = 0;
  iVar2 = this->SocketFD;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_518.fds_bits[iVar1 >> 6] = local_518.fds_bits[iVar1 >> 6] | 1L << ((byte)iVar2 & 0x3f);
  dVar10 = floor(timeoutSec);
  local_560.tv_sec = (__time_t)dVar10;
  local_560.tv_usec = (__suseconds_t)((timeoutSec - (double)local_560.tv_sec) * 1000000.0);
  iVar2 = select(iVar2 + 1,&local_518,(fd_set *)0x0,(fd_set *)0x0,&local_560);
  if (iVar2 == -1) {
    poVar4 = this->outStr;
    pcVar9 = "Recv: select failed: ";
    lVar8 = 0x15;
  }
  else {
    if (iVar2 < 1) {
      return iVar2;
    }
    if (this->FirstRun == true) {
      local_550.msg_iov = &local_570;
      local_550.msg_name = local_498;
      local_550.msg_namelen = 0x80;
      local_550.msg_iovlen = 1;
      local_550.msg_control = local_418;
      local_550.msg_controllen = 1000;
      local_570.iov_base = bufrecv;
      local_570.iov_len = maxlen;
      sVar3 = recvmsg(this->SocketFD,(msghdr *)&local_550,0);
      iVar2 = (int)sVar3;
      ExtractInterfaceInfo(this,&local_550);
      poVar4 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Using interface ",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->InterfaceName)._M_dataplus._M_p,
                          (this->InterfaceName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->InterfaceIndex);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"), MTU: ",8);
      plVar5 = (long *)std::ostream::operator<<((ostream *)poVar4,this->InterfaceMTU);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      this->FirstRun = false;
    }
    else {
      sVar3 = recv(this->SocketFD,bufrecv,maxlen,0);
      iVar2 = (int)sVar3;
    }
    if (iVar2 != -1) {
      return iVar2;
    }
    poVar4 = this->outStr;
    pcVar9 = "Recv: failed to receive: ";
    lVar8 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,lVar8);
  piVar6 = __errno_location();
  pcVar9 = strerror(*piVar6);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return -1;
}

Assistant:

int SocketInternals::Recv(unsigned char *bufrecv, size_t maxlen, const double timeoutSec)
{
    fd_set readfds;
    FD_ZERO(&readfds);
    FD_SET(SocketFD, &readfds);

#ifdef _MSC_VER
    long sec = static_cast<long>(floor(timeoutSec));
    long usec = static_cast<long>((timeoutSec - sec) * 1e6);
    int nfds = 1;   // On Windows, this parameter to select is ignored
#else
    time_t sec = static_cast<time_t>(floor(timeoutSec));
    suseconds_t usec = static_cast<suseconds_t>((timeoutSec - sec) * 1e6);
    int nfds = SocketFD+1;
#endif
    timeval timeout = { sec , usec };
    int retval = select(nfds, &readfds, NULL, NULL, &timeout);

    // It is o.k. to check against SOCKET_ERROR. On Windows, this is correct.
    // On Linux, we should check for -1 (which is how SOCKET_ERROR is defined above).
    if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
        outStr << "Recv: select failed: " << WSAGetLastError() << std::endl;
#else
        outStr << "Recv: select failed: " << strerror(errno) << std::endl;
#endif
    }
    else if (retval > 0) {

        if (FirstRun) {

            const size_t CONTROL_DATA_SIZE = 1000;  // THIS NEEDS TO BE BIG ENOUGH.
            char controldata[CONTROL_DATA_SIZE];
            MsgHeaderType hdr;

#ifdef _MSC_VER
            SOCKADDR addrRemote;
            GUID WSARecvMsg_GUID = WSAID_WSARECVMSG;
            LPFN_WSARECVMSG WSARecvMsg;
            DWORD nBytes;
            retval = WSAIoctl(SocketFD, SIO_GET_EXTENSION_FUNCTION_POINTER, &WSARecvMsg_GUID,
                              sizeof(WSARecvMsg_GUID), &WSARecvMsg, sizeof(WSARecvMsg), &nBytes,
                              NULL, NULL);
            if (retval == SOCKET_ERROR) {
                outStr << "Recv: could not get WSARecvMsg function pointer" << std::endl;
            }
            else {
                WSABUF WSAbuf;
                WSAbuf.buf = reinterpret_cast<char *>(bufrecv);
                WSAbuf.len = maxlen;

                hdr.name = &addrRemote;
                hdr.namelen = sizeof(addrRemote);
                hdr.lpBuffers = &WSAbuf;
                hdr.dwBufferCount = 1;
                hdr.Control.buf = controldata;
                hdr.Control.len = CONTROL_DATA_SIZE;
                hdr.dwFlags = MSG_PEEK;  // Do not remove message from queue

                retval = WSARecvMsg(SocketFD, &hdr, &nBytes, NULL, NULL);
                if (retval == SOCKET_ERROR)
                    outStr << "Recv: WSARecvMsg failed" << std::endl;
                else
                    ExtractInterfaceInfo(&hdr);
            }
            // For some reason, the call to WSARecvMsg (without MSG_PEEK flag) does
            // not work, so we instead specify MSG_PEEK above and call recv again.
            // This also handles the error case (unable to get WSARecvMsg pointer).
            retval = recv(SocketFD, reinterpret_cast<char *>(bufrecv), maxlen, 0);
#else
            sockaddr_storage addrRemote;

            struct iovec vec;
            vec.iov_base = bufrecv;
            vec.iov_len = maxlen;

            hdr.msg_name = &addrRemote;
            hdr.msg_namelen = sizeof(addrRemote);
            hdr.msg_iov = &vec;
            hdr.msg_iovlen = 1;
            hdr.msg_control = controldata;
            hdr.msg_controllen = CONTROL_DATA_SIZE;

            retval = recvmsg(SocketFD, &hdr, 0);
            ExtractInterfaceInfo(&hdr);
#endif

            outStr << "Using interface " << InterfaceName << " (" << InterfaceIndex << "), MTU: " << InterfaceMTU << std::endl;
            FirstRun = false;
        } else {
            //struct sockaddr_in fromAddr;
            //socklen_t length = sizeof(fromAddr);
            //retval = recvfrom(socketFD, bufrecv, maxlen, 0, reinterpret_cast<struct sockaddr *>(&fromAddr), &length);
            retval = recv(SocketFD, reinterpret_cast<char *>(bufrecv), maxlen, 0);
        }
        if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
            outStr << "Recv: failed to receive: " << WSAGetLastError() << std::endl;
#else
            outStr << "Recv: failed to receive: " << strerror(errno) << std::endl;
#endif
        }
    }
    return retval;
}